

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::VirtualInterfaceTypeSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,VirtualInterfaceTypeSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  size_t index_local;
  VirtualInterfaceTypeSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->virtualKeyword).kind;
    token._2_1_ = (this->virtualKeyword).field_0x2;
    token.numFlags.raw = (this->virtualKeyword).numFlags.raw;
    token.rawLen = (this->virtualKeyword).rawLen;
    token.info = (this->virtualKeyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->interfaceKeyword).kind;
    token_00._2_1_ = (this->interfaceKeyword).field_0x2;
    token_00.numFlags.raw = (this->interfaceKeyword).numFlags.raw;
    token_00.rawLen = (this->interfaceKeyword).rawLen;
    token_00.info = (this->interfaceKeyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    token_01.kind = (this->name).kind;
    token_01._2_1_ = (this->name).field_0x2;
    token_01.numFlags.raw = (this->name).numFlags.raw;
    token_01.rawLen = (this->name).rawLen;
    token_01.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->parameters->super_SyntaxNode);
    break;
  case 4:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->modport->super_SyntaxNode);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax VirtualInterfaceTypeSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return virtualKeyword;
        case 1: return interfaceKeyword;
        case 2: return name;
        case 3: return parameters;
        case 4: return modport;
        default: return nullptr;
    }
}